

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf128.c
# Opt level: O3

void cf_gf128_double(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  bool bVar4;
  byte *pbVar5;
  bool bVar6;
  uint uVar7;
  byte bVar8;
  byte local_2 [2];
  
  local_2[1] = 0;
  local_2[0] = 0x87;
  uVar7 = in[3];
  uVar3 = uVar7 * 2;
  out[3] = uVar3;
  uVar1 = in[2];
  out[2] = uVar7 >> 0x1f | uVar1 << 1;
  uVar7 = in[1];
  out[1] = uVar1 >> 0x1f | uVar7 << 1;
  uVar2 = *in;
  *out = uVar7 >> 0x1f | uVar2 << 1;
  bVar8 = 0;
  uVar7 = 0;
  pbVar5 = local_2 + 1;
  bVar4 = true;
  do {
    bVar6 = bVar4;
    if (bVar8 == (byte)(uVar2 >> 0x1f)) {
      uVar7 = (uint)*pbVar5;
    }
    bVar8 = 1;
    pbVar5 = local_2;
    bVar4 = false;
  } while (bVar6);
  out[3] = uVar3 ^ uVar7;
  return;
}

Assistant:

void cf_gf128_double(const cf_gf128 in, cf_gf128 out)
{
  uint8_t table[2] = { 0x00, 0x87 };
  uint32_t borrow = 0;
  uint32_t inword;

  inword = in[3];   out[3] = (inword << 1) | borrow;  borrow = inword >> 31;
  inword = in[2];   out[2] = (inword << 1) | borrow;  borrow = inword >> 31;
  inword = in[1];   out[1] = (inword << 1) | borrow;  borrow = inword >> 31;
  inword = in[0];   out[0] = (inword << 1) | borrow;  borrow = inword >> 31;
  
#if CF_CACHE_SIDE_CHANNEL_PROTECTION
  out[3] ^= select_u8(borrow, table, 2);
#else
  out[3] ^= table[borrow];
#endif
}